

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O0

void callExternalFunc(vm *v,function *f)

{
  uint64 uVar1;
  uint local_40;
  uint local_3c;
  int i_1;
  int i;
  stack pr_stack;
  function *f_local;
  vm *v_local;
  
  pr_stack.bp = (uint64 *)f;
  initStack((stack *)&i_1);
  for (local_3c = 0; local_3c < (uint)*pr_stack.bp; local_3c = local_3c + 1) {
    uVar1 = popU64(&v->operandStack);
    pushU64((stack *)&i_1,uVar1);
  }
  (*(code *)pr_stack.bp[5])(&i_1);
  for (local_40 = 0; local_40 < (uint)pr_stack.bp[2]; local_40 = local_40 + 1) {
    uVar1 = popU64((stack *)&i_1);
    pushU64(&v->operandStack,uVar1);
  }
  freeStack((stack *)&i_1);
  return;
}

Assistant:

void callExternalFunc(vm *v, function *f) {
    stack pr_stack;
    initStack(&pr_stack);
    for (int i = 0; i < f->tp.param_count; ++i) {
        pushU64(&pr_stack, popU64(&v->operandStack));
    }
    f->native(&pr_stack);
    for (int i = 0; i < f->tp.return_count; ++i) {
        pushU64(&v->operandStack, popU64(&pr_stack));
    }
    freeStack(&pr_stack);
}